

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum-dtoa.cc
# Opt level: O0

void double_conversion::BignumToFixed
               (int requested_digits,int *decimal_point,Bignum *numerator,Bignum *denominator,
               Vector<char> buffer,int *length)

{
  Vector<char> buffer_00;
  int iVar1;
  char *pcVar2;
  undefined8 in_RCX;
  Bignum *in_RDX;
  Bignum *in_RSI;
  int in_EDI;
  Bignum *in_R8;
  undefined4 in_R9D;
  undefined4 *in_stack_00000008;
  int needed_digits;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 uStack_4;
  
  if (in_EDI < -*(int *)in_RSI) {
    *(int *)in_RSI = -in_EDI;
    *in_stack_00000008 = 0;
  }
  else if (-*(int *)in_RSI == in_EDI) {
    Bignum::Times10((Bignum *)0x87e7fb);
    iVar1 = Bignum::PlusCompare((Bignum *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),in_RSI,in_RDX);
    if (iVar1 < 0) {
      *in_stack_00000008 = 0;
    }
    else {
      pcVar2 = Vector<char>::operator[]((Vector<char> *)&stack0xfffffffffffffff0,0);
      *pcVar2 = '1';
      *in_stack_00000008 = 1;
      *(int *)in_RSI = *(int *)in_RSI + 1;
    }
  }
  else {
    buffer_00._8_8_ = in_RSI;
    buffer_00.start_ = (char *)in_RDX;
    GenerateCountedDigits
              ((int)((ulong)in_RCX >> 0x20),
               (int *)CONCAT44(*(int *)in_RSI + in_EDI,in_stack_ffffffffffffffc8),
               (Bignum *)CONCAT44(uStack_4,in_R9D),in_R8,buffer_00,(int *)in_R8);
  }
  return;
}

Assistant:

static void BignumToFixed(int requested_digits, int* decimal_point,
                          Bignum* numerator, Bignum* denominator,
                          Vector<char> buffer, int* length) {
  // Note that we have to look at more than just the requested_digits, since
  // a number could be rounded up. Example: v=0.5 with requested_digits=0.
  // Even though the power of v equals 0 we can't just stop here.
  if (-(*decimal_point) > requested_digits) {
    // The number is definitively too small.
    // Ex: 0.001 with requested_digits == 1.
    // Set decimal-point to -requested_digits. This is what Gay does.
    // Note that it should not have any effect anyways since the string is
    // empty.
    *decimal_point = -requested_digits;
    *length = 0;
    return;
  } else if (-(*decimal_point) == requested_digits) {
    // We only need to verify if the number rounds down or up.
    // Ex: 0.04 and 0.06 with requested_digits == 1.
    DOUBLE_CONVERSION_ASSERT(*decimal_point == -requested_digits);
    // Initially the fraction lies in range (1, 10]. Multiply the denominator
    // by 10 so that we can compare more easily.
    denominator->Times10();
    if (Bignum::PlusCompare(*numerator, *numerator, *denominator) >= 0) {
      // If the fraction is >= 0.5 then we have to include the rounded
      // digit.
      buffer[0] = '1';
      *length = 1;
      (*decimal_point)++;
    } else {
      // Note that we caught most of similar cases earlier.
      *length = 0;
    }
    return;
  } else {
    // The requested digits correspond to the digits after the point.
    // The variable 'needed_digits' includes the digits before the point.
    int needed_digits = (*decimal_point) + requested_digits;
    GenerateCountedDigits(needed_digits, decimal_point,
                          numerator, denominator,
                          buffer, length);
  }
}